

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int recv_with_timeout(amqp_connection_state_t state,amqp_time_t timeout)

{
  int iVar1;
  size_t sVar2;
  int event;
  
  do {
    sVar2 = (*state->socket->klass->recv)
                      (state->socket,(state->sock_inbound_buffer).bytes,
                       (state->sock_inbound_buffer).len,0);
    if (-1 < (long)sVar2) {
      state->sock_inbound_limit = sVar2;
      state->sock_inbound_offset = 0;
      iVar1 = amqp_time_s_from_now(&state->next_recv_heartbeat,state->heartbeat * 2);
      return iVar1;
    }
    iVar1 = amqp_get_sockfd(state);
    if (iVar1 == -1) {
      return -7;
    }
    if (sVar2 == 0xffffffffffffecfe) {
      event = 4;
    }
    else {
      event = 2;
      if (sVar2 != 0xffffffffffffecff) {
        return (int)sVar2;
      }
    }
    iVar1 = amqp_poll(iVar1,event,timeout);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

static int recv_with_timeout(amqp_connection_state_t state,
                             amqp_time_t timeout) {
  ssize_t res;
  int fd;

start_recv:
  res = amqp_socket_recv(state->socket, state->sock_inbound_buffer.bytes,
                         state->sock_inbound_buffer.len, 0);

  if (res < 0) {
    fd = amqp_get_sockfd(state);
    if (-1 == fd) {
      return AMQP_STATUS_CONNECTION_CLOSED;
    }
    switch (res) {
      default:
        return (int)res;
      case AMQP_PRIVATE_STATUS_SOCKET_NEEDREAD:
        res = amqp_poll(fd, AMQP_SF_POLLIN, timeout);
        break;
      case AMQP_PRIVATE_STATUS_SOCKET_NEEDWRITE:
        res = amqp_poll(fd, AMQP_SF_POLLOUT, timeout);
        break;
    }
    if (AMQP_STATUS_OK == res) {
      goto start_recv;
    }
    return (int)res;
  }

  state->sock_inbound_limit = res;
  state->sock_inbound_offset = 0;

  res = amqp_time_s_from_now(&state->next_recv_heartbeat,
                             amqp_heartbeat_recv(state));
  if (AMQP_STATUS_OK != res) {
    return (int)res;
  }
  return AMQP_STATUS_OK;
}